

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_img_decompress(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  bool bVar2;
  undefined8 local_f8;
  double dnulval;
  undefined8 *puStack_e8;
  float fnulval;
  float *nulladdr;
  long imgsize;
  long inc [6];
  LONGLONG lpixel [6];
  LONGLONG fpixel [6];
  int local_40;
  uint local_3c;
  int anynul;
  int nullcheck;
  int datatype;
  int ii;
  int *status_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  anynul = 0;
  _datatype = status;
  status_local = &outfptr->HDUposition;
  outfptr_local = infptr;
  iVar1 = fits_img_decompress_header(infptr,outfptr,status);
  if (iVar1 < 1) {
    ffrdef((fitsfile *)status_local,_datatype);
    ffpscl((fitsfile *)status_local,1.0,0.0,_datatype);
    ffpscl(outfptr_local,1.0,0.0,_datatype);
    local_3c = 0;
    puStack_e8 = (undefined8 *)((long)&dnulval + 4);
    if (outfptr_local->Fptr->zbitpix == 8) {
      anynul = 0xb;
    }
    else if (outfptr_local->Fptr->zbitpix == 0x10) {
      anynul = 0x15;
    }
    else if (outfptr_local->Fptr->zbitpix == 0x20) {
      anynul = 0x1f;
    }
    else if (outfptr_local->Fptr->zbitpix == -0x20) {
      local_3c = 1;
      dnulval._4_4_ = 0x8541f136;
      puStack_e8 = (undefined8 *)((long)&dnulval + 4);
      anynul = 0x2a;
    }
    else {
      bVar2 = outfptr_local->Fptr->zbitpix == -0x40;
      if (bVar2) {
        local_f8 = 0xb8a83e285ebab4b7;
        puStack_e8 = &local_f8;
        anynul = 0x52;
      }
      local_3c = (uint)bVar2;
    }
    nulladdr = (float *)0x1;
    for (nullcheck = 0; nullcheck < outfptr_local->Fptr->zndim; nullcheck = nullcheck + 1) {
      nulladdr = (float *)(outfptr_local->Fptr->znaxis[nullcheck] * (long)nulladdr);
      lpixel[(long)nullcheck + 5] = 1;
      inc[(long)nullcheck + 5] = outfptr_local->Fptr->znaxis[nullcheck];
      inc[(long)nullcheck + -1] = 1;
    }
    fits_read_write_compressed_img
              (outfptr_local,anynul,lpixel + 5,inc + 5,&imgsize,local_3c,puStack_e8,&local_40,
               (fitsfile *)status_local,_datatype);
    infptr_local._4_4_ = *_datatype;
  }
  else {
    infptr_local._4_4_ = *_datatype;
  }
  return infptr_local._4_4_;
}

Assistant:

int fits_img_decompress (fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  This routine decompresses the whole image and writes it to the output file.
*/

{
    int ii, datatype = 0;
    int nullcheck, anynul;
    LONGLONG fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long imgsize;
    float *nulladdr, fnulval;
    double dnulval;

    if (fits_img_decompress_header(infptr, outfptr, status) > 0)
    {
    	return (*status);
    }

    /* force a rescan of the output header keywords, then reset the scaling */
    /* in case the BSCALE and BZERO keywords are present, so that the       */
    /* decompressed values won't be scaled when written to the output image */
    ffrdef(outfptr, status);
    ffpscl(outfptr, 1.0, 0.0, status);
    ffpscl(infptr, 1.0, 0.0, status);

    /* initialize; no null checking is needed for integer images */
    nullcheck = 0;
    nulladdr =  &fnulval;

    /* determine datatype for image */
    if ((infptr->Fptr)->zbitpix == BYTE_IMG)
    {
        datatype = TBYTE;
    }
    else if ((infptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
    }
    else if ((infptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
    }
    else if ((infptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        /* In the case of float images we must check for NaNs  */
        nullcheck = 1;
        fnulval = FLOATNULLVALUE;
        nulladdr =  &fnulval;
        datatype = TFLOAT;
    }
    else if ((infptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        /* In the case of double images we must check for NaNs  */
        nullcheck = 1;
        dnulval = DOUBLENULLVALUE;
        nulladdr = (float *) &dnulval;
        datatype = TDOUBLE;
    }

    /* calculate size of the image (in pixels) */
    imgsize = 1;
    for (ii = 0; ii < (infptr->Fptr)->zndim; ii++)
    {
        imgsize *= (infptr->Fptr)->znaxis[ii];
        fpixel[ii] = 1;              /* Set first and last pixel to */
        lpixel[ii] = (infptr->Fptr)->znaxis[ii]; /* include the entire image. */
        inc[ii] = 1;
    }

    /* uncompress the input image and write to output image, one tile at a time */

    fits_read_write_compressed_img(infptr, datatype, fpixel, lpixel, inc,  
            nullcheck, nulladdr, &anynul, outfptr, status);

    return (*status);
}